

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O0

void __thiscall re2c::Binary::emit(Binary *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  OutputFile *pOVar1;
  bool *readCh_local;
  uint32_t ind_local;
  OutputFile *o_local;
  Binary *this_local;
  
  output_if(o,ind,readCh,&this->cond->compare,this->cond->value);
  OutputFile::ws(o,"{\n");
  If::emit(this->thn,o,ind + 1,readCh);
  pOVar1 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar1,"} else {\n");
  If::emit(this->els,o,ind + 1,readCh);
  pOVar1 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar1,"}\n");
  return;
}

Assistant:

void Binary::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	output_if (o, ind, readCh, cond->compare, cond->value);
	o.ws("{\n");
	thn->emit (o, ind + 1, readCh);
	o.wind(ind).ws("} else {\n");
	els->emit (o, ind + 1, readCh);
	o.wind(ind).ws("}\n");
}